

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmudp.c
# Opt level: O0

void * libcmudp_LTX_initialize(CManager cm,CMtrans_services_conflict svc)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  udp_transport_data_ptr udp_data;
  
  (*(code *)in_RSI[6])(in_RDI,"Initialize CMUdp transport");
  if (libcmudp_LTX_initialize::atom_init == 0) {
    CM_UDP_PORT = attr_atom_from_string("UDP_PORT");
    CM_UDP_ADDR = attr_atom_from_string("UDP_ADDR");
    CM_IP_HOSTNAME = attr_atom_from_string("IP_HOST");
    CM_TRANSPORT = attr_atom_from_string("CM_TRANSPORT");
    CM_TRANSPORT_RELIABLE = attr_atom_from_string("CM_TRANSPORT_RELIABLE");
    libcmudp_LTX_initialize::atom_init = libcmudp_LTX_initialize::atom_init + 1;
  }
  puVar1 = (undefined8 *)(*(code *)*in_RSI)(0x30);
  *puVar1 = in_RDI;
  puVar1[1] = in_RSI;
  *(undefined4 *)(puVar1 + 2) = 0xffffffff;
  *(undefined4 *)((long)puVar1 + 0x14) = 0;
  *(undefined4 *)(puVar1 + 3) = 0;
  puVar1[5] = 0;
  uVar2 = create_attr_list();
  puVar1[4] = uVar2;
  add_int_attr(puVar1[4],CM_TRANSPORT_RELIABLE,0);
  (*(code *)in_RSI[9])(in_RDI,free_udp_data,puVar1,2);
  return puVar1;
}

Assistant:

extern void *
libcmudp_LTX_initialize(CManager cm, CMtrans_services svc)
{
    static int atom_init = 0;

    udp_transport_data_ptr udp_data;
    svc->trace_out(cm, "Initialize CMUdp transport");
#ifdef HAVE_WINDOWS_H
    if (socket_global_init == 0) {
	int nErrorStatus;
	/* initialize the winsock package */
	nErrorStatus = WSAStartup(wVersionRequested, &wsaData);
	if (nErrorStatus != 0) {
	    fprintf(stderr, "Could not initialize windows socket library!");
	    WSACleanup();
	    exit(-1);
	}
    }
#endif
    if (atom_init == 0) {
	CM_UDP_PORT = attr_atom_from_string("UDP_PORT");
	CM_UDP_ADDR = attr_atom_from_string("UDP_ADDR");
	CM_IP_HOSTNAME = attr_atom_from_string("IP_HOST");
	CM_TRANSPORT = attr_atom_from_string("CM_TRANSPORT");
	CM_TRANSPORT_RELIABLE = attr_atom_from_string("CM_TRANSPORT_RELIABLE");
	atom_init++;
    }
    udp_data = svc->malloc_func(sizeof(struct udp_transport_data));
    udp_data->cm = cm;
    udp_data->svc = svc;
    udp_data->socket_fd = -1;
    udp_data->self_ip = 0;
    udp_data->self_port = 0;
    udp_data->connections = NULL;
    udp_data->characteristics = create_attr_list();
    add_int_attr(udp_data->characteristics, CM_TRANSPORT_RELIABLE, 0);
    svc->add_shutdown_task(cm, free_udp_data, (void *) udp_data, FREE_TASK);
    return (void *) udp_data;
}